

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void processILibs(string *config,cmGeneratorTarget *headTarget,cmLinkItem *item,
                 cmGlobalGenerator *gg,
                 vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *tgts
                 ,set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                  *emitted)

{
  pointer *pppcVar1;
  iterator __position;
  cmLinkInterfaceLibraries *pcVar2;
  cmGeneratorTarget **__v;
  pointer item_00;
  pair<std::_Rb_tree_iterator<const_cmGeneratorTarget_*>,_bool> pVar3;
  
  if (item->Target != (cmGeneratorTarget *)0x0) {
    __v = &item->Target;
    pVar3 = std::
            _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
            ::_M_insert_unique<cmGeneratorTarget_const*const&>
                      ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                        *)emitted,__v);
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      __position._M_current =
           (tgts->
           super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (tgts->
          super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>)
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>::
        _M_realloc_insert<cmGeneratorTarget_const*const&>
                  ((vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>> *)tgts
                   ,__position,__v);
      }
      else {
        *__position._M_current = *__v;
        pppcVar1 = &(tgts->
                    super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        *pppcVar1 = *pppcVar1 + 1;
      }
      pcVar2 = cmGeneratorTarget::GetLinkInterfaceLibraries(*__v,config,headTarget,true);
      if (pcVar2 != (cmLinkInterfaceLibraries *)0x0) {
        for (item_00 = (pcVar2->Libraries).
                       super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                       super__Vector_impl_data._M_start;
            item_00 !=
            (pcVar2->Libraries).super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
            super__Vector_impl_data._M_finish; item_00 = item_00 + 1) {
          processILibs(config,headTarget,item_00,gg,tgts,emitted);
        }
      }
    }
  }
  return;
}

Assistant:

void processILibs(const std::string& config,
                  cmGeneratorTarget const* headTarget, cmLinkItem const& item,
                  cmGlobalGenerator* gg,
                  std::vector<cmGeneratorTarget const*>& tgts,
                  std::set<cmGeneratorTarget const*>& emitted)
{
  if (item.Target && emitted.insert(item.Target).second) {
    tgts.push_back(item.Target);
    if (cmLinkInterfaceLibraries const* iface =
          item.Target->GetLinkInterfaceLibraries(config, headTarget, true)) {
      for (std::vector<cmLinkItem>::const_iterator it =
             iface->Libraries.begin();
           it != iface->Libraries.end(); ++it) {
        processILibs(config, headTarget, *it, gg, tgts, emitted);
      }
    }
  }
}